

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchroniser.cpp
# Opt level: O2

void __thiscall
Synchroniser::decideWhichAndHowMuchInEach2extractFromSender
          (Synchroniser *this,wallet *sendersWallet,linkedList<myString> *btcId2extract_list,
          linkedList<int> *amountInEachBtc2extract_list,int amount2extract,
          linkedList<myString> *indexesList2remove)

{
  int iVar1;
  linkedList<myString> *plVar2;
  linkedList<int> *plVar3;
  int iVar4;
  l_node<myString> *right;
  linkedList<myString> local_b8;
  myString local_98;
  linkedList<int> local_80;
  myString local_60;
  myString local_48;
  
  wallet::getBtcIdsOwned_list(&local_b8,sendersWallet);
  wallet::getAmountOnEachBtc(&local_80,sendersWallet);
  if (local_b8.size == local_80.size) {
    linkedList<int>::~linkedList(&local_80);
    linkedList<myString>::~linkedList(&local_b8);
    plVar2 = wallet::getBtcIdsOwned_listByRef(sendersWallet);
    right = plVar2->head;
    plVar3 = wallet::getAmountOnEachBtcByRef(sendersWallet);
    while( true ) {
      plVar3 = (linkedList<int> *)plVar3->head;
      iVar4 = amount2extract - *(int *)&plVar3->_vptr_linkedList;
      if (iVar4 == 0 || amount2extract < *(int *)&plVar3->_vptr_linkedList) break;
      myString::myString(&local_48,&right->data);
      linkedList<myString>::insert_last(btcId2extract_list,&local_48);
      myString::~myString(&local_48);
      linkedList<int>::insert_last(amountInEachBtc2extract_list,*(int *)&plVar3->_vptr_linkedList);
      iVar1 = wallet::getBalance(sendersWallet);
      wallet::setBalance(sendersWallet,iVar1 - *(int *)&plVar3->_vptr_linkedList);
      myString::myString(&local_60,&right->data);
      linkedList<myString>::insert_last(indexesList2remove,&local_60);
      myString::~myString(&local_60);
      *(int *)&plVar3->_vptr_linkedList = 0;
      wallet::getBtcIdsOwned_list(&local_b8,sendersWallet);
      linkedList<myString>::~linkedList(&local_b8);
      right = right->next;
      wallet::getAmountOnEachBtc((linkedList<int> *)&local_b8,sendersWallet);
      linkedList<int>::~linkedList((linkedList<int> *)&local_b8);
      amount2extract = iVar4;
    }
    myString::myString(&local_98,&right->data);
    linkedList<myString>::insert_last(btcId2extract_list,&local_98);
    myString::~myString(&local_98);
    linkedList<int>::insert_last(amountInEachBtc2extract_list,amount2extract);
    *(int *)&plVar3->_vptr_linkedList = *(int *)&plVar3->_vptr_linkedList - amount2extract;
    iVar4 = wallet::getBalance(sendersWallet);
    wallet::setBalance(sendersWallet,iVar4 - amount2extract);
    return;
  }
  __assert_fail("sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DimitrisGan[P]transactionBitCoinSystem/synchroniser.cpp"
                ,0x5b,
                "void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *, linkedList<myString> &, linkedList<int> &, int, linkedList<myString> &)"
               );
}

Assistant:

void Synchroniser::decideWhichAndHowMuchInEach2extractFromSender(wallet *sendersWallet,
                                                                 linkedList<myString> &btcId2extract_list,
                                                                 linkedList<int> &amountInEachBtc2extract_list,
                                                                 int amount2extract,
                                                                 linkedList<myString> &indexesList2remove) {

    int amountRemain2gather =amount2extract;

    linkedList<myString>::Iterator  ItA;
    linkedList<int>::Iterator  ItB;

    assert(sendersWallet->getBtcIdsOwned_list().getSize() == sendersWallet->getAmountOnEachBtc().getSize());



    ItA = sendersWallet->getBtcIdsOwned_listByRef().begin();
    ItB = sendersWallet->getAmountOnEachBtcByRef().begin();
    /*
     * ItA = btcId name
     * ItB = amount owned of the current btc
     **/
    int index =0; //maybe is needed to deleteByIndex if a btc to senders wallet reached zero
    while(true) //iterate simultaneously the 2 lists
    {

        //do stuff with ItA and ItB

        if (*ItB >= amountRemain2gather){ //means that the percentage amount of this btc is bigger than the remain2extract
            btcId2extract_list.insert_last(*ItA);
            amountInEachBtc2extract_list.insert_last(amountRemain2gather);

            *ItB = *ItB - amountRemain2gather; //reduce the amount from the owner(=sender) wallet
            sendersWallet->setBalance(sendersWallet->getBalance() - amountRemain2gather); //update the new total baalnce
            amountRemain2gather=0;

            break;

        }
        else { //means that the wallet will give all his onwership to this btc
            amountRemain2gather -= *ItB;

            btcId2extract_list.insert_last(*ItA); //add btcId in exchange list
            amountInEachBtc2extract_list.insert_last(*ItB);
            sendersWallet->setBalance(sendersWallet->getBalance() - *ItB); //update the new total baalnce

            indexesList2remove.insert_last(*ItA);
            *ItB = 0; //the wallet(=sender) is not owner of this btc anymore

        }


        index++;

        if(ItA != sendersWallet->getBtcIdsOwned_list().end())
        {
            ++ItA;
        }
        if(ItB != sendersWallet->getAmountOnEachBtc().end())
        {
            ++ItB;
        }
//        if(ItA == sendersWallet->getBtcIdsOwned_list().end() && ItB == sendersWallet->getAmountOnEachBtc().end())
//        {
//            break;
//        }
    }
}